

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarmath_p.h
# Opt level: O2

R_conflict20 QRomanCalendrical::dayInYearToYmd(int dayInYear)

{
  R_conflict16 RVar1;
  R_conflict16 RVar2;
  R_conflict20 RVar3;
  
  RVar1 = QRoundingDown::qDivMod<153U,_int,_true>(dayInYear * 5 + 2);
  RVar2 = QRoundingDown::qDivMod<12U,_int,_true>(RVar1.quotient + 2);
  RVar1 = QRoundingDown::qDivMod<5U,_int,_true>(RVar1.remainder);
  RVar3.day = RVar1.quotient + 1;
  RVar3._0_8_ = (long)RVar2 + 0x100000000;
  return RVar3;
}

Assistant:

constexpr auto dayInYearToYmd(int dayInYear)
{
    // The year is an adjustment to the year for which dayInYear may be denormal.
    struct R { int year; int month; int day; };
    // Shared code for Julian and Milankovic (at least).
    using namespace QRoundingDown;
    const auto month5Day = qDivMod<FiveMonths>(5 * dayInYear + 2);
    // Its remainder changes by 5 per day, except at roughly monthly quotient steps.
    const auto yearMonth = qDivMod<12>(month5Day.quotient + 2);
    return R { yearMonth.quotient, yearMonth.remainder + 1, qDiv<5>(month5Day.remainder) + 1 };
}